

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool TaprootBuilder::ValidDepths(vector<int,_std::allocator<int>_> *depths)

{
  long lVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong __n;
  uint *puVar6;
  long in_FS_OFFSET;
  bool bVar7;
  reference rVar8;
  vector<bool,_std::allocator<bool>_> branch;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  puVar2 = (uint *)(depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar6 = (uint *)(depths->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    __n = (ulong)*puVar6;
    if ((0x80 < __n) ||
       (uVar3 = (ulong)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
       __n + 1 < uVar3 + ((long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8)
       ) goto LAB_00351d37;
    while (uVar3 = uVar3 + ((long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           (long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) *
                           8, __n < uVar3) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&branch,__n);
      if ((*rVar8._M_p & rVar8._M_mask) == 0) {
        uVar3 = (ulong)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                ((long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        break;
      }
      bVar7 = branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset == 0;
      branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset =
           branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar3 = (ulong)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      if (bVar7) {
        branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_offset = 0x3f;
        branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
        .super__Bit_iterator_base._M_p =
             branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
        uVar3 = 0x3f;
      }
      iVar5 = (int)__n;
      __n = (ulong)(iVar5 - 1);
      if (iVar5 == 0) goto LAB_00351d37;
    }
    if (uVar3 <= __n) {
      std::vector<bool,_std::allocator<bool>_>::resize(&branch,__n + 1,false);
    }
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&branch,__n);
    if ((*rVar8._M_p & rVar8._M_mask) != 0) {
      __assert_fail("!branch[depth]",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                    ,0x167,"static bool TaprootBuilder::ValidDepths(const std::vector<int> &)");
    }
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&branch,__n);
    *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
  }
  lVar4 = ((long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_p -
          (long)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p) * 8 +
          (ulong)branch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._M_offset;
  if (lVar4 == 0) {
    bVar7 = true;
  }
  else if (lVar4 == 1) {
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](&branch,0);
    bVar7 = (*rVar8._M_p & rVar8._M_mask) != 0;
  }
  else {
LAB_00351d37:
    bVar7 = false;
  }
  ::wallet::_GLOBAL__N_1::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&branch);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool TaprootBuilder::ValidDepths(const std::vector<int>& depths)
{
    std::vector<bool> branch;
    for (int depth : depths) {
        // This inner loop corresponds to effectively the same logic on branch
        // as what Insert() performs on the m_branch variable. Instead of
        // storing a NodeInfo object, just remember whether or not there is one
        // at that depth.
        if (depth < 0 || (size_t)depth > TAPROOT_CONTROL_MAX_NODE_COUNT) return false;
        if ((size_t)depth + 1 < branch.size()) return false;
        while (branch.size() > (size_t)depth && branch[depth]) {
            branch.pop_back();
            if (depth == 0) return false;
            --depth;
        }
        if (branch.size() <= (size_t)depth) branch.resize((size_t)depth + 1);
        assert(!branch[depth]);
        branch[depth] = true;
    }
    // And this check corresponds to the IsComplete() check on m_branch.
    return branch.size() == 0 || (branch.size() == 1 && branch[0]);
}